

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<kj::StringPtr_&> __thiscall
kj::Table<kj::StringPtr,kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>>::
find<0ul,kj::String&>
          (Table<kj::StringPtr,kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>> *this,
          char (*params) [7])

{
  uint uVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  undefined8 *in_RDX;
  char *pcVar5;
  size_t in_R8;
  StringPtr a;
  StringPtr b;
  Iterator iter;
  Iterator IStack_68;
  long local_50;
  long local_48;
  SearchKey local_40;
  char *local_38;
  long *local_30;
  
  local_38 = params[4] + 4;
  local_50 = *(long *)params;
  local_48 = *(long *)(params[1] + 1) - local_50 >> 4;
  local_30 = &local_50;
  local_40._vptr_SearchKey = (_func_char_7_ **)&PTR_search_0021ba78;
  _::BTreeImpl::search(&IStack_68,(BTreeImpl *)(params[5] + 5),&local_40);
  if (((ulong)IStack_68.row != 0xe) && (uVar1 = (IStack_68.leaf)->rows[IStack_68.row].i, uVar1 != 0)
     ) {
    lVar3 = (ulong)(uVar1 - 1) * 0x10;
    lVar4 = in_RDX[1];
    if (lVar4 == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*in_RDX;
    }
    b.content.ptr = (char *)(lVar4 + (ulong)(lVar4 == 0));
    a.content.size_ = (size_t)pcVar5;
    a.content.ptr = *(char **)(local_50 + 8 + lVar3);
    b.content.size_ = in_R8;
    bVar2 = _::anon_unknown_0::StringCompare::matches(*(StringCompare **)(local_50 + lVar3),a,b);
    if (bVar2) {
      lVar4 = (ulong)((IStack_68.leaf)->rows[IStack_68.row].i - 1) * 0x10 + *(long *)params;
      goto LAB_0015e7f0;
    }
  }
  lVar4 = 0;
LAB_0015e7f0:
  *(long *)this = lVar4;
  return (Maybe<kj::StringPtr_&>)(StringPtr *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}